

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

int Gia_ManQuantCheckOverlap(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  ulong uVar2;
  ulong *puVar3;
  uint uVar4;
  
  uVar1 = p->nSuppWords;
  uVar2 = (ulong)uVar1;
  uVar4 = iObj * uVar1;
  if ((-1 < (int)uVar4) && ((int)uVar4 < p->vSuppWords->nSize)) {
    if (0 < (int)uVar1) {
      puVar3 = p->vSuppWords->pArray;
      do {
        if ((puVar3[uVar4] & *puVar3) != 0) {
          return 1;
        }
        puVar3 = puVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ManQuantCheckOverlap( Gia_Man_t * p, int iObj )
{
    return Abc_TtIntersect( Gia_ManQuantInfoId(p, iObj), Gia_ManQuantInfoId(p, 0), p->nSuppWords, 0 );
}